

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
::find_or_prepare_insert_non_soo<char[5]>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
          *this,char (*key) [5])

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  ushort uVar3;
  bool bVar4;
  char cVar5;
  ushort uVar6;
  uint32_t uVar7;
  uint uVar8;
  size_t sVar9;
  size_t hash;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i match;
  ctrl_t cVar13;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  undefined1 auVar14 [16];
  iterator iVar30;
  string_view v;
  FindInfo FVar31;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_88;
  ulong local_70;
  EqualElement<char[5]> local_68;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  sVar9 = strlen(*key);
  v._M_str = *key;
  v._M_len = sVar9;
  hash = StringHash::operator()((StringHash *)this,v);
  probe(&local_88,(CommonFields *)this,hash);
  pcVar2 = (this->settings_).
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  auVar11 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar11 = pshuflw(auVar11,auVar11,0);
  uVar10 = auVar11._0_4_;
  auVar11._4_4_ = uVar10;
  auVar11._0_4_ = uVar10;
  auVar11._8_4_ = uVar10;
  auVar11._12_4_ = uVar10;
  do {
    pcVar1 = pcVar2 + local_88.offset_;
    auVar12[0] = -(auVar11[0] == *pcVar1);
    auVar12[1] = -(auVar11[1] == pcVar1[1]);
    auVar12[2] = -(auVar11[2] == pcVar1[2]);
    auVar12[3] = -(auVar11[3] == pcVar1[3]);
    auVar12[4] = -(auVar11[4] == pcVar1[4]);
    auVar12[5] = -(auVar11[5] == pcVar1[5]);
    auVar12[6] = -(auVar11[6] == pcVar1[6]);
    auVar12[7] = -(auVar11[7] == pcVar1[7]);
    auVar12[8] = -(auVar11[8] == pcVar1[8]);
    auVar12[9] = -(auVar11[9] == pcVar1[9]);
    auVar12[10] = -(auVar11[10] == pcVar1[10]);
    auVar12[0xb] = -(auVar11[0xb] == pcVar1[0xb]);
    auVar12[0xc] = -(auVar11[0xc] == pcVar1[0xc]);
    auVar12[0xd] = -(auVar11[0xd] == pcVar1[0xd]);
    auVar12[0xe] = -(auVar11[0xe] == pcVar1[0xe]);
    auVar12[0xf] = -(auVar11[0xf] == pcVar1[0xf]);
    cVar13 = *pcVar1;
    cVar15 = pcVar1[1];
    cVar16 = pcVar1[2];
    cVar17 = pcVar1[3];
    cVar18 = pcVar1[4];
    cVar19 = pcVar1[5];
    cVar20 = pcVar1[6];
    cVar21 = pcVar1[7];
    cVar22 = pcVar1[8];
    cVar23 = pcVar1[9];
    cVar24 = pcVar1[10];
    cVar25 = pcVar1[0xb];
    cVar26 = pcVar1[0xc];
    cVar27 = pcVar1[0xd];
    cVar28 = pcVar1[0xe];
    cVar29 = pcVar1[0xf];
    for (uVar6 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
        ; uVar6 != 0; uVar6 = uVar6 - 1 & uVar6) {
      local_70 = hash;
      local_58 = cVar13;
      cStack_57 = cVar15;
      cStack_56 = cVar16;
      cStack_55 = cVar17;
      cStack_54 = cVar18;
      cStack_53 = cVar19;
      cStack_52 = cVar20;
      cStack_51 = cVar21;
      cStack_50 = cVar22;
      cStack_4f = cVar23;
      cStack_4e = cVar24;
      cStack_4d = cVar25;
      cStack_4c = cVar26;
      cStack_4b = cVar27;
      cStack_4a = cVar28;
      cStack_49 = cVar29;
      local_48 = auVar11;
      uVar7 = TrailingZeros<unsigned_short>(uVar6);
      local_68.rhs = key;
      local_68.eq = (key_equal *)this;
      bVar4 = DecomposePair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>::EqualElement<char[5]>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>&>
                        (&local_68,
                         (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>
                          *)((local_88.offset_ + uVar7 & local_88.mask_) * 0x18 +
                            (long)(this->settings_).
                                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                  .value.heap_or_soo_.heap.slot_array.p));
      if (bVar4) {
        local_88.mask_ = uVar7 + local_88.offset_ & local_88.mask_;
        bVar4 = false;
        goto LAB_001b613c;
      }
      hash = local_70;
      auVar11 = local_48;
      cVar13 = local_58;
      cVar15 = cStack_57;
      cVar16 = cStack_56;
      cVar17 = cStack_55;
      cVar18 = cStack_54;
      cVar19 = cStack_53;
      cVar20 = cStack_52;
      cVar21 = cStack_51;
      cVar22 = cStack_50;
      cVar23 = cStack_4f;
      cVar24 = cStack_4e;
      cVar25 = cStack_4d;
      cVar26 = cStack_4c;
      cVar27 = cStack_4b;
      cVar28 = cStack_4a;
      cVar29 = cStack_49;
    }
    auVar14[0] = -(cVar13 == kEmpty);
    auVar14[1] = -(cVar15 == kEmpty);
    auVar14[2] = -(cVar16 == kEmpty);
    auVar14[3] = -(cVar17 == kEmpty);
    auVar14[4] = -(cVar18 == kEmpty);
    auVar14[5] = -(cVar19 == kEmpty);
    auVar14[6] = -(cVar20 == kEmpty);
    auVar14[7] = -(cVar21 == kEmpty);
    auVar14[8] = -(cVar22 == kEmpty);
    auVar14[9] = -(cVar23 == kEmpty);
    auVar14[10] = -(cVar24 == kEmpty);
    auVar14[0xb] = -(cVar25 == kEmpty);
    auVar14[0xc] = -(cVar26 == kEmpty);
    auVar14[0xd] = -(cVar27 == kEmpty);
    auVar14[0xe] = -(cVar28 == kEmpty);
    auVar14[0xf] = -(cVar29 == kEmpty);
    uVar6 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf;
    if (uVar6 != 0) {
      cVar5 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        ((this->settings_).
                         super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                         .value.capacity_,hash,
                         (this->settings_).
                         super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                         .value.heap_or_soo_.heap.control);
      if (cVar5 == '\0') {
        uVar8 = TrailingZeros<unsigned_short>(uVar6);
      }
      else {
        uVar3 = 0xf;
        if (uVar6 != 0) {
          for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar8 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      FVar31.offset = uVar8 + local_88.offset_ & local_88.mask_;
      FVar31.probe_length = local_88.index_;
      local_88.mask_ =
           absl::lts_20240722::container_internal::PrepareInsertNonSoo
                     ((CommonFields *)this,hash,FVar31,
                      (PolicyFunctions *)
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
                      ::GetPolicyFunctions()::value);
      bVar4 = true;
LAB_001b613c:
      iVar30 = iterator_at(this,local_88.mask_);
      __return_storage_ptr__->first = iVar30;
      __return_storage_ptr__->second = bVar4;
      return __return_storage_ptr__;
    }
    local_88.index_ = local_88.index_ + 0x10;
    local_88.offset_ = local_88.offset_ + local_88.index_ & local_88.mask_;
    if ((this->settings_).
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ < local_88.index_) {
      __assert_fail("seq.index() <= capacity() && \"full table!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xef5,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>, K = char[5]]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }